

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

TypeBase ** __thiscall
SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U>::find
          (SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U> *this,
          TypeModulePair *key)

{
  Node *this_00;
  uint uVar1;
  Node *pNVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  InplaceStr local_48;
  ModuleData *local_38;
  
  uVar1 = this->bucketCount;
  uVar4 = NULLC::GetStringHash((key->typeName).begin,(key->typeName).end);
  uVar5 = NULLC::GetStringHash((key->importModule->name).begin,(key->importModule->name).end);
  if (this->bucketCount != 0) {
    uVar5 = uVar5 + uVar4;
    uVar4 = 0;
    do {
      uVar5 = uVar5 & uVar1 - 1;
      pNVar2 = this->data;
      this_00 = pNVar2 + uVar5;
      local_48.begin = (char *)0x0;
      local_48.end = (char *)0x0;
      local_38 = (ModuleData *)0x0;
      bVar3 = InplaceStr::operator==((InplaceStr *)this_00,&local_48);
      if ((bVar3) && (pNVar2[uVar5].key.importModule == local_38)) {
        return (TypeBase **)0x0;
      }
      bVar3 = InplaceStr::operator==((InplaceStr *)this_00,&key->typeName);
      if ((bVar3) && ((this_00->key).importModule == key->importModule)) {
        return &this_00->value;
      }
      uVar5 = uVar5 + uVar4 + 1;
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->bucketCount);
  }
  return (TypeBase **)0x0;
}

Assistant:

Value* find(const Key& key) const
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
				return NULL;

			if(item.key == key)
				return &item.value;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return NULL;
	}